

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPo.c
# Opt level: O2

void Acec_PrintSignature(Vec_Wec_t *vMonos)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p;
  int i;
  char *pcVar4;
  
  printf("Output signature with %d monomials:\n");
  for (i = 0; i < vMonos->nSize; i = i + 1) {
    p = Vec_WecEntry(vMonos,i);
    iVar1 = Vec_IntEntryLast(p);
    pcVar4 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -";
    if (0 < iVar1) {
      pcVar4 = "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +";
    }
    iVar2 = Vec_IntEntryLast(p);
    iVar1 = -iVar2;
    if (0 < iVar2) {
      iVar1 = iVar2;
    }
    printf("  %s2^%d",pcVar4 + 0x4a,(ulong)(iVar1 - 1));
    for (iVar1 = 0; iVar1 < p->nSize + -1; iVar1 = iVar1 + 1) {
      uVar3 = Vec_IntEntry(p,iVar1);
      printf(" * ");
      if ((int)uVar3 < 0) {
        uVar3 = ~uVar3;
        pcVar4 = "i%d";
      }
      else {
        pcVar4 = "o%d";
      }
      printf(pcVar4,(ulong)uVar3);
    }
    putchar(10);
  }
  return;
}

Assistant:

void Acec_PrintSignature( Vec_Wec_t * vMonos )
{
    Vec_Int_t * vLevel; int i, k, Entry;
    printf( "Output signature with %d monomials:\n", Vec_WecSize(vMonos) );
    Vec_WecForEachLevel( vMonos, vLevel, i )
    {
        printf( "  %s2^%d", Vec_IntEntryLast(vLevel) > 0 ? "+":"-", Abc_AbsInt(Vec_IntEntryLast(vLevel))-1 );
        Vec_IntForEachEntryStop( vLevel, Entry, k, Vec_IntSize(vLevel)-1 )
        {
            printf( " * " );
            if ( Entry < 0 )
                printf( "i%d", -Entry-1 );
            else 
                printf( "o%d", Entry );
        }
        printf( "\n" );
    }
}